

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::SSARewriter::PhiCandidate::PrettyPrint_abi_cxx11_
          (string *__return_storage_ptr__,PhiCandidate *this,CFG *cfg)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  ostream *poVar5;
  size_type sVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference puVar7;
  const_reference pvVar8;
  char *pcVar9;
  uint32_t arg_id;
  uint32_t pred_label;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  ostringstream local_198 [4];
  uint32_t arg_ix;
  ostringstream str;
  CFG *cfg_local;
  PhiCandidate *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar5 = std::operator<<((ostream *)local_198,"%");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->result_id_);
  poVar5 = std::operator<<(poVar5," = Phi[%");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->var_id_);
  poVar5 = std::operator<<(poVar5,", BB %");
  uVar4 = BasicBlock::id(this->bb_);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
  std::operator<<(poVar5,"](");
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->phi_args_);
  if (sVar6 != 0) {
    __range3._4_4_ = 0;
    uVar4 = BasicBlock::id(this->bb_);
    this_00 = CFG::preds(cfg,uVar4);
    __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    _arg_id = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&arg_id), bVar3) {
      puVar7 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end3);
      uVar1 = *puVar7;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->phi_args_,(ulong)__range3._4_4_);
      uVar2 = *pvVar8;
      poVar5 = std::operator<<((ostream *)local_198,"[%");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
      poVar5 = std::operator<<(poVar5,", bb(%");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
      std::operator<<(poVar5,")] ");
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3);
      __range3._4_4_ = __range3._4_4_ + 1;
    }
  }
  std::operator<<((ostream *)local_198,")");
  if (this->copy_of_ != 0) {
    poVar5 = std::operator<<((ostream *)local_198,"  [COPY OF ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->copy_of_);
    std::operator<<(poVar5,"]");
  }
  pcVar9 = "  [INCOMPLETE]";
  if ((this->is_complete_ & 1U) != 0) {
    pcVar9 = "  [COMPLETE]";
  }
  std::operator<<((ostream *)local_198,pcVar9);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string SSARewriter::PhiCandidate::PrettyPrint(const CFG* cfg) const {
  std::ostringstream str;
  str << "%" << result_id_ << " = Phi[%" << var_id_ << ", BB %" << bb_->id()
      << "](";
  if (phi_args_.size() > 0) {
    uint32_t arg_ix = 0;
    for (uint32_t pred_label : cfg->preds(bb_->id())) {
      uint32_t arg_id = phi_args_[arg_ix++];
      str << "[%" << arg_id << ", bb(%" << pred_label << ")] ";
    }
  }
  str << ")";
  if (copy_of_ != 0) {
    str << "  [COPY OF " << copy_of_ << "]";
  }
  str << ((is_complete_) ? "  [COMPLETE]" : "  [INCOMPLETE]");

  return str.str();
}